

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Writer::NotifyEngineAttribute(BP5Writer *this,string *name,DataType type)

{
  allocator local_b1;
  string local_b0 [36];
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"BP5Writer",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Engine",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff78,"ThrowUp",(allocator *)&stack0xffffffffffffff77);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Engine does not support NotifyEngineAttribute",&local_b1);
  helper::Throw<std::invalid_argument>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void BP5Writer::NotifyEngineAttribute(std::string name, DataType type) noexcept
{
    helper::Throw<std::invalid_argument>("BP5Writer", "Engine", "ThrowUp",
                                         "Engine does not support NotifyEngineAttribute");
}